

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_circle_sector
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_68;
  float local_5c;
  float local_58;
  float fStack_54;
  
  iVar3 = start_angle;
  if (start_angle < end_angle) {
    iVar3 = end_angle;
  }
  fVar7 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar5 = -0.5 / fVar7 + 1.0;
    fVar5 = fVar5 * fVar5;
    fVar5 = acosf(fVar5 + fVar5 + -1.0);
    local_68 = (float)(iVar3 - start_angle);
    fVar5 = ceilf(6.2831855 / fVar5);
    iVar3 = (int)((fVar5 * local_68) / 360.0);
    segments = 4;
    if (0 < iVar3) {
      segments = iVar3;
    }
  }
  else {
    local_68 = (float)(iVar3 - start_angle);
  }
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar4 = prVar1->current_buffer;
  prVar2 = prVar1->vertex_buffers;
  if (prVar2[lVar4].elements_count * 4 <= segments * 3 + prVar2[lVar4].v_counter) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  if (0 < segments) {
    local_5c = (float)start_angle;
    lVar4 = (long)segments;
    fStack_54 = center.y;
    do {
      rf_gfx_color4ub(color.r,color.g,color.b,color.a);
      local_58 = center.x;
      rf_gfx_vertex3f(local_58,fStack_54,((rf__ctx->field_0).current_batch)->current_depth);
      fVar5 = sinf(local_5c * 0.017453292);
      fVar6 = cosf(local_5c * 0.017453292);
      rf_gfx_vertex3f(fVar5 * fVar7 + local_58,fVar6 * fVar7 + fStack_54,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      local_5c = local_5c + local_68 / (float)segments;
      fVar5 = sinf(local_5c * 0.017453292);
      fVar6 = cosf(local_5c * 0.017453292);
      rf_gfx_vertex3f(fVar5 * fVar7 + local_58,fVar6 * fVar7 + fStack_54,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088
        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(3*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }
    rf_gfx_end();
}